

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaPSimpleTypeErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlSchemaBasicItemPtr ownerItem,
               xmlNodePtr node,xmlSchemaTypePtr type,char *expected,xmlChar *value,char *message,
               xmlChar *str1,xmlChar *str2)

{
  uint uVar1;
  int iVar2;
  xmlChar *pxVar3;
  char *pcVar4;
  xmlChar *pxVar5;
  xmlChar *in_stack_ffffffffffffffb0;
  xmlChar *pxVar6;
  undefined4 in_stack_ffffffffffffffb8;
  xmlChar *in_stack_ffffffffffffffc0;
  
  pxVar5 = (xmlChar *)0x0;
  xmlSchemaFormatNodeForError
            ((xmlChar **)&stack0xffffffffffffffa8,(xmlSchemaAbstractCtxtPtr)ctxt,
             (xmlNodePtr)ownerItem);
  if (value != (xmlChar *)0x0) {
    pxVar5 = xmlStrcat(pxVar5,value);
    pxVar5 = xmlStrcat(pxVar5,".\n");
    xmlSchemaPErrExt(ctxt,(xmlNodePtr)ownerItem,error,pxVar5,(xmlChar *)message,(xmlChar *)0x0,
                     (char *)0x0,(xmlChar *)0x0,pxVar5,in_stack_ffffffffffffffb0,
                     (xmlChar *)CONCAT44(error,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffc0)
    ;
    goto LAB_001b1a6a;
  }
  if (node == (xmlNodePtr)0x0) {
    if (*(int *)&ownerItem->dummy == 2) {
      pcVar4 = "The value \'%s\' is not valid.";
    }
    else {
      pcVar4 = "The character content is not valid.";
    }
    pxVar5 = xmlStrcat(pxVar5,(xmlChar *)pcVar4);
  }
  else {
    pcVar4 = "The character content is not a valid value of ";
    if (*(int *)&ownerItem->dummy == 2) {
      pcVar4 = "\'%s\' is not a valid value of ";
    }
    pxVar5 = xmlStrcat(pxVar5,(xmlChar *)pcVar4);
    iVar2 = xmlSchemaIsGlobalItem((xmlSchemaTypePtr)node);
    pcVar4 = "the ";
    if (iVar2 == 0) {
      pcVar4 = "the local ";
    }
    pxVar3 = xmlStrcat(pxVar5,(xmlChar *)pcVar4);
    uVar1 = *(uint *)&node->properties;
    if ((uVar1 >> 8 & 1) == 0) {
      if ((uVar1 & 0x40) != 0) {
        pcVar4 = "list type";
        goto LAB_001b18e9;
      }
      if ((char)uVar1 < '\0') {
        pcVar4 = "union type";
        goto LAB_001b18e9;
      }
    }
    else {
      pcVar4 = "atomic type";
LAB_001b18e9:
      pxVar3 = xmlStrcat(pxVar3,(xmlChar *)pcVar4);
    }
    pxVar5 = pxVar3;
    iVar2 = xmlSchemaIsGlobalItem((xmlSchemaTypePtr)node);
    if (iVar2 != 0) {
      pxVar6 = (xmlChar *)0x0;
      pxVar5 = xmlStrcat(pxVar3," \'");
      if (*(int *)&node[1].parent == 0) {
        pxVar3 = xmlSchemaFormatQName
                           ((xmlChar **)&stack0xffffffffffffffb0,(xmlChar *)node[1].properties,
                            node->name);
        if (pxVar6 == (xmlChar *)0x0) goto LAB_001b1945;
      }
      else {
        pxVar5 = xmlStrcat(pxVar5,"xs:");
        pxVar3 = node->name;
LAB_001b1945:
        pxVar6 = xmlStrdup(pxVar3);
      }
      pxVar3 = xmlEscapeFormatString((xmlChar **)&stack0xffffffffffffffb0);
      pxVar5 = xmlStrcat(pxVar5,pxVar3);
      pxVar5 = xmlStrcat(pxVar5,(xmlChar *)"\'.");
      if (pxVar6 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar6);
      }
    }
  }
  if (type == (xmlSchemaTypePtr)0x0) {
    pxVar3 = "\n";
  }
  else {
    pxVar3 = xmlCharStrdup((char *)type);
    pxVar5 = xmlStrcat(pxVar5,(xmlChar *)" Expected is \'");
    pxVar6 = xmlEscapeFormatString((xmlChar **)&stack0xffffffffffffffb0);
    pxVar5 = xmlStrcat(pxVar5,pxVar6);
    if (pxVar3 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar3);
    }
    pxVar3 = "\'.\n";
  }
  pxVar5 = xmlStrcat(pxVar5,pxVar3);
  if (*(int *)&ownerItem->dummy != 2) {
    expected = (char *)0x0;
  }
  xmlSchemaPErr(ctxt,(xmlNodePtr)ownerItem,error,(char *)pxVar5,(xmlChar *)expected,(xmlChar *)0x0);
LAB_001b1a6a:
  if (pxVar5 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar5);
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(8,0)
xmlSchemaPSimpleTypeErr(xmlSchemaParserCtxtPtr ctxt,
			xmlParserErrors error,
			xmlSchemaBasicItemPtr ownerItem ATTRIBUTE_UNUSED,
			xmlNodePtr node,
			xmlSchemaTypePtr type,
			const char *expected,
			const xmlChar *value,
			const char *message,
			const xmlChar *str1,
			const xmlChar *str2)
{
    xmlChar *msg = NULL;

    xmlSchemaFormatNodeForError(&msg, ACTXT_CAST ctxt, node);
    if (message == NULL) {
	/*
	* Use default messages.
	*/
	if (type != NULL) {
	    if (node->type == XML_ATTRIBUTE_NODE)
		msg = xmlStrcat(msg, BAD_CAST "'%s' is not a valid value of ");
	    else
		msg = xmlStrcat(msg, BAD_CAST "The character content is not a "
		"valid value of ");
	    if (! xmlSchemaIsGlobalItem(type))
		msg = xmlStrcat(msg, BAD_CAST "the local ");
	    else
		msg = xmlStrcat(msg, BAD_CAST "the ");

	    if (WXS_IS_ATOMIC(type))
		msg = xmlStrcat(msg, BAD_CAST "atomic type");
	    else if (WXS_IS_LIST(type))
		msg = xmlStrcat(msg, BAD_CAST "list type");
	    else if (WXS_IS_UNION(type))
		msg = xmlStrcat(msg, BAD_CAST "union type");

	    if (xmlSchemaIsGlobalItem(type)) {
		xmlChar *str = NULL;
		msg = xmlStrcat(msg, BAD_CAST " '");
		if (type->builtInType != 0) {
		    msg = xmlStrcat(msg, BAD_CAST "xs:");
		    str = xmlStrdup(type->name);
		} else {
		    const xmlChar *qName = xmlSchemaFormatQName(&str, type->targetNamespace, type->name);
		    if (!str)
			str = xmlStrdup(qName);
		}
		msg = xmlStrcat(msg, xmlEscapeFormatString(&str));
		msg = xmlStrcat(msg, BAD_CAST "'.");
		FREE_AND_NULL(str);
	    }
	} else {
	    if (node->type == XML_ATTRIBUTE_NODE)
		msg = xmlStrcat(msg, BAD_CAST "The value '%s' is not valid.");
	    else
		msg = xmlStrcat(msg, BAD_CAST "The character content is not "
		"valid.");
	}
	if (expected) {
	    xmlChar *expectedEscaped = xmlCharStrdup(expected);
	    msg = xmlStrcat(msg, BAD_CAST " Expected is '");
	    msg = xmlStrcat(msg, xmlEscapeFormatString(&expectedEscaped));
	    FREE_AND_NULL(expectedEscaped);
	    msg = xmlStrcat(msg, BAD_CAST "'.\n");
	} else
	    msg = xmlStrcat(msg, BAD_CAST "\n");
	if (node->type == XML_ATTRIBUTE_NODE)
	    xmlSchemaPErr(ctxt, node, error, (const char *) msg, value, NULL);
	else
	    xmlSchemaPErr(ctxt, node, error, (const char *) msg, NULL, NULL);
    }